

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall
docopt::Option::Option(Option *this,string *shortOption,string *longOption,int argcount,value *v)

{
  bool bVar1;
  ulong uVar2;
  string *local_e0;
  value local_b0;
  value local_78;
  string local_50;
  value *local_30;
  value *v_local;
  string *psStack_20;
  int argcount_local;
  string *longOption_local;
  string *shortOption_local;
  Option *this_local;
  
  local_30 = v;
  v_local._4_4_ = argcount;
  psStack_20 = longOption;
  longOption_local = shortOption;
  shortOption_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  local_e0 = shortOption;
  if ((uVar2 & 1) == 0) {
    local_e0 = longOption;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)local_e0);
  docopt::value::value(&local_78,v);
  LeafPattern::LeafPattern(&this->super_LeafPattern,&local_50,&local_78);
  docopt::value::~value(&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_003333a0;
  std::__cxx11::string::string((string *)&this->fShortOption,(string *)shortOption);
  std::__cxx11::string::string((string *)&this->fLongOption,(string *)longOption);
  this->fArgcount = v_local._4_4_;
  if (((v_local._4_4_ != 0) && (bVar1 = docopt::value::isBool(v), bVar1)) &&
     (bVar1 = docopt::value::asBool(v), !bVar1)) {
    docopt::value::value(&local_b0);
    LeafPattern::setValue(&this->super_LeafPattern,&local_b0);
    docopt::value::~value(&local_b0);
  }
  return;
}

Assistant:

Option(std::string shortOption,
		       std::string longOption,
		       int argcount = 0,
		       value v = value{false})
		: LeafPattern(longOption.empty() ? shortOption : longOption,
			      std::move(v)),
		  fShortOption(std::move(shortOption)),
		  fLongOption(std::move(longOption)),
		  fArgcount(argcount)
		{
			// From Python:
			//   self.value = None if value is False and argcount else value
			if (argcount && v.isBool() && !v.asBool()) {
				setValue(value{});
			}
		}